

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_lake_shrine_platforms_map.hpp
# Opt level: O3

void __thiscall
PatchOptimizeLakeShrinePlatformsMap::inject_code
          (PatchOptimizeLakeShrinePlatformsMap *this,ROM *rom,World *world)

{
  uint32_t uVar1;
  mapped_type *ppMVar2;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::DataRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  Code func;
  allocator_type local_122;
  allocator_type local_121;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_100;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_e8;
  ROM *local_d0;
  Code local_c8;
  DataRegister local_50;
  AddressRegister local_40;
  
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50.super_Register._code = '\0';
  local_50.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  __l._M_len = 1;
  __l._M_array = &local_50;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_100,__l,&local_121);
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR_getXn_00262c50;
  local_110._M_local_buf[8] = 1;
  local_110._M_allocated_capacity = (size_type)&PTR_getXn_00262c50;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_120;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_e8,__l_00,&local_122);
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  md::Code::movem(&local_c8,&local_100,&local_e8,true,&local_40,LONG);
  if (local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_120._0_8_ = &PTR_getXn_00262cd8;
  local_120._8_8_ = 0x200ff5430;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_100.
                        super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  local_d0 = rom;
  md::Code::move(&local_c8,(Param *)local_120,(Param *)&local_100,WORD);
  local_120._0_8_ = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"player_not_on_entity","");
  md::Code::bmi(&local_c8,(string *)local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != &local_110) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
  }
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_100.
                        super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  local_120._0_8_ = &PTR_getXn_00262c98;
  local_120._8_8_ = 0x100000500;
  md::Code::cmpi(&local_c8,(ImmediateValue *)local_120,(Param *)&local_100,WORD);
  local_120._0_8_ = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"player_not_on_entity","");
  md::Code::bgt(&local_c8,(string *)local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != &local_110) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
  }
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  local_120._0_8_ = &PTR_getXn_00262cd8;
  local_120._8_8_ = 0x200ff5400;
  md::Code::lea(&local_c8,(Param *)local_120,(AddressRegister *)&local_100);
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR_getXn_00262be0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_100.
                         super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                         _M_impl.super__Vector_impl_data._M_finish._1_7_,1);
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  md::Code::adda(&local_c8,(Param *)local_120,(AddressRegister *)&local_100);
  local_120._0_8_ = &PTR_getXn_00262d18;
  local_110._M_local_buf[0] = 1;
  local_120._8_8_ = &PTR_getXn_00262c50;
  local_110._8_2_ = 0x32;
  local_110._M_local_buf[10] = '\x02';
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c98;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x20009b458;
  md::Code::cmpi(&local_c8,(ImmediateValue *)&local_100,(Param *)local_120,LONG);
  local_120._0_8_ = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"player_not_on_entity","");
  md::Code::bne(&local_c8,(string *)local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != &local_110) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
  }
  local_120._0_8_ = &PTR_getXn_00262d18;
  local_110._M_local_buf[0] = '\x01';
  local_120._8_8_ = &PTR_getXn_00262c50;
  local_110._8_2_ = 0x32;
  local_110._M_local_buf[10] = '\x02';
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c98;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x20009b652;
  md::Code::move(&local_c8,(Param *)&local_100,(Param *)local_120,LONG);
  local_120._0_8_ = &PTR_getXn_00262d18;
  local_110._M_local_buf[0] = 1;
  local_120._8_8_ = &PTR_getXn_00262c50;
  local_110._8_2_ = 0x2a;
  local_110._M_local_buf[10] = '\x02';
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c98;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x100001d00;
  md::Code::move(&local_c8,(Param *)&local_100,(Param *)local_120,WORD);
  local_120._0_8_ = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"player_not_on_entity","");
  md::Code::label(&local_c8,(string *)local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != &local_110) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
  }
  local_50.super_Register._code = '\0';
  local_50.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  __l_01._M_len = 1;
  __l_01._M_array = &local_50;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_100,__l_01,&local_121);
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR_getXn_00262c50;
  local_110._M_local_buf[8] = 1;
  local_110._M_allocated_capacity = (size_type)&PTR_getXn_00262c50;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_120;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_e8,__l_02,&local_122);
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  md::Code::movem(&local_c8,&local_100,&local_e8,false,&local_40,LONG);
  if (local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  md::Code::rts(&local_c8);
  local_120._0_8_ = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  uVar1 = md::ROM::inject_code(local_d0,&local_c8,(string *)local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != &local_110) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
  }
  local_120._0_2_ = 0x142;
  ppMVar2 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(&world->_maps,(key_type *)local_120);
  (*ppMVar2)->_map_update_addr = uVar1;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_c8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c8._pending_branches._M_t);
  if (local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        constexpr uint32_t ADDR_NO_BEHAVIOR = 0x0009B458;
        constexpr uint32_t ADDR_BEHAVIOR_FALL = 0x0009B652;

        md::Code func;
        func.movem_to_stack({ reg_D0 }, { reg_A0, reg_A1 });
        {
            func.movew(addr_(0xFF5430), reg_D0);    // D0 = entity underneath player
            func.bmi("player_not_on_entity");
            func.cmpiw(0x500, reg_D0);
            func.bgt("player_not_on_entity");
            {
                // Player is on a platform
                func.lea(0xFF5400, reg_A1);
                func.adda(reg_D0, reg_A1);
                func.cmpil(ADDR_NO_BEHAVIOR, addr_(reg_A1, 0x32));
                func.bne("player_not_on_entity");
                // Player is on a platform that can actually fall, trigger the usual behavior
                func.movel(ADDR_BEHAVIOR_FALL, addr_(reg_A1, 0x32));
                func.movew(0x1D00, addr_(reg_A1, 0x2A));
            }
            func.label("player_not_on_entity");

        }
        func.movem_from_stack({ reg_D0 }, { reg_A0, reg_A1 });
        func.rts();

        uint32_t update_func_addr = rom.inject_code(func);
        world.map(MAP_LAKE_SHRINE_322)->map_update_addr(update_func_addr);
    }